

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

Diagnostic * slang::ast::operator<<(Diagnostic *diag,Type *arg)

{
  pair<std::type_index,_std::any> local_20;
  
  local_20.first._M_target = (type_info *)&Type_const*::typeinfo;
  local_20.second._M_manager = std::any::_Manager_internal<const_slang::ast::Type_*>::_S_manage;
  local_20.second._M_storage = (_Storage)arg;
  std::
  vector<std::variant<std::__cxx11::string,long,unsigned_long,char,slang::ConstantValue,std::pair<std::type_index,std::any>>,std::allocator<std::variant<std::__cxx11::string,long,unsigned_long,char,slang::ConstantValue,std::pair<std::type_index,std::any>>>>
  ::emplace_back<std::pair<std::type_index,std::any>>
            ((vector<std::variant<std::__cxx11::string,long,unsigned_long,char,slang::ConstantValue,std::pair<std::type_index,std::any>>,std::allocator<std::variant<std::__cxx11::string,long,unsigned_long,char,slang::ConstantValue,std::pair<std::type_index,std::any>>>>
              *)diag,&local_20);
  if (local_20.second._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_20.second._M_manager)(_Op_destroy,&local_20.second,(_Arg *)0x0);
  }
  return diag;
}

Assistant:

Diagnostic& operator<<(Diagnostic& diag, const Type& arg) {
    SLANG_ASSERT(!arg.isError());
    diag.args.emplace_back(Diagnostic::CustomArgType{SLANG_TYPEOF(const Type*), &arg});
    return diag;
}